

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::CompilerGLSL::request_workaround_wrapper_overload
          (CompilerGLSL *this,TypeID id)

{
  size_t sVar1;
  TypedID<(diligent_spirv_cross::Types)1> *pTVar2;
  
  pTVar2 = (this->workaround_ubo_load_overload_types).
           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.ptr;
  pTVar2 = ::std::
           __find_if<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>*,__gnu_cxx::__ops::_Iter_equals_val<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>const>>
                     (pTVar2,pTVar2 + (this->workaround_ubo_load_overload_types).
                                      super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                                      .buffer_size);
  if (pTVar2 == (this->workaround_ubo_load_overload_types).
                super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.ptr
                + (this->workaround_ubo_load_overload_types).
                  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
                  buffer_size) {
    Compiler::force_recompile(&this->super_Compiler);
    SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_8UL>::reserve
              (&this->workaround_ubo_load_overload_types,
               (this->workaround_ubo_load_overload_types).
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
               buffer_size + 1);
    sVar1 = (this->workaround_ubo_load_overload_types).
            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
            buffer_size;
    (this->workaround_ubo_load_overload_types).
    super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.ptr[sVar1].id =
         id.id;
    (this->workaround_ubo_load_overload_types).
    super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.buffer_size =
         sVar1 + 1;
  }
  return;
}

Assistant:

void CompilerGLSL::request_workaround_wrapper_overload(TypeID id)
{
	// Must be ordered to maintain deterministic output, so vector is appropriate.
	if (find(begin(workaround_ubo_load_overload_types), end(workaround_ubo_load_overload_types), id) ==
	    end(workaround_ubo_load_overload_types))
	{
		force_recompile();
		workaround_ubo_load_overload_types.push_back(id);
	}
}